

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExecutionReport.h
# Opt level: O0

void __thiscall
FIX43::ExecutionReport::ExecutionReport
          (ExecutionReport *this,OrderID *aOrderID,ExecID *aExecID,ExecType *aExecType,
          OrdStatus *aOrdStatus,Side *aSide,LeavesQty *aLeavesQty,CumQty *aCumQty,AvgPx *aAvgPx)

{
  MsgType local_90;
  Side *local_38;
  Side *aSide_local;
  OrdStatus *aOrdStatus_local;
  ExecType *aExecType_local;
  ExecID *aExecID_local;
  OrderID *aOrderID_local;
  ExecutionReport *this_local;
  
  local_38 = aSide;
  aSide_local = (Side *)aOrdStatus;
  aOrdStatus_local = (OrdStatus *)aExecType;
  aExecType_local = (ExecType *)aExecID;
  aExecID_local = (ExecID *)aOrderID;
  aOrderID_local = (OrderID *)this;
  MsgType();
  FIX43::Message::Message(&this->super_Message,&local_90);
  FIX::MsgType::~MsgType(&local_90);
  *(undefined ***)&this->super_Message = &PTR__ExecutionReport_0017c8e8;
  set(this,(OrderID *)aExecID_local);
  set(this,(ExecID *)aExecType_local);
  set(this,(ExecType *)aOrdStatus_local);
  set(this,(OrdStatus *)aSide_local);
  set(this,local_38);
  set(this,aLeavesQty);
  set(this,aCumQty);
  set(this,aAvgPx);
  return;
}

Assistant:

ExecutionReport(
      const FIX::OrderID& aOrderID,
      const FIX::ExecID& aExecID,
      const FIX::ExecType& aExecType,
      const FIX::OrdStatus& aOrdStatus,
      const FIX::Side& aSide,
      const FIX::LeavesQty& aLeavesQty,
      const FIX::CumQty& aCumQty,
      const FIX::AvgPx& aAvgPx )
    : Message(MsgType())
    {
      set(aOrderID);
      set(aExecID);
      set(aExecType);
      set(aOrdStatus);
      set(aSide);
      set(aLeavesQty);
      set(aCumQty);
      set(aAvgPx);
    }